

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O3

FlowDecl * __thiscall AnalyzerFlow::flow_decl(AnalyzerFlow *this)

{
  FlowDecl *pFVar1;
  Exception *this_00;
  string local_40;
  
  if (FLAGS_pac_debug) {
    flow_decl(this);
  }
  pFVar1 = this->flow_decl_;
  if (pFVar1 == (FlowDecl *)0x0) {
    pFVar1 = (FlowDecl *)Decl::LookUpDecl((ID *)0x1104d3);
    if ((pFVar1 == (FlowDecl *)0x0) ||
       ((pFVar1->super_AnalyzerDecl).super_TypeDecl.super_Decl.decl_type_ != FLOW)) {
      pFVar1 = this->flow_decl_;
      if (pFVar1 == (FlowDecl *)0x0) {
        this_00 = (Exception *)__cxa_allocate_exception(0x20);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"cannot find the flow declaration","");
        Exception::Exception(this_00,&(this->super_AnalyzerElement).super_Object,&local_40);
        __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
      }
    }
    else {
      this->flow_decl_ = pFVar1;
    }
  }
  return pFVar1;
}

Assistant:

FlowDecl* AnalyzerFlow::flow_decl()
	{
	DEBUG_MSG("Getting flow_decl for %s\n", type_id_->Name());
	if ( ! flow_decl_ )
		{
		Decl* decl = Decl::LookUpDecl(type_id_);
		if ( decl && decl->decl_type() == Decl::FLOW )
			flow_decl_ = static_cast<FlowDecl*>(decl);
		if ( ! flow_decl_ )
			{
			throw Exception(this, "cannot find the flow declaration");
			}
		}
	return flow_decl_;
	}